

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O0

void down_sample_uv(int uiCWidth,int uiCHeight,int bitDept,pel *pSrc,int uiSrcStride,pel *pDst,
                   int uiDstStride)

{
  int iVar1;
  int i4;
  int i2;
  int i;
  int j;
  int val_v;
  int val_u;
  pel *pDst_local;
  pel *ppStack_20;
  int uiSrcStride_local;
  pel *pSrc_local;
  int bitDept_local;
  int uiCHeight_local;
  int uiCWidth_local;
  
  _val_v = pDst;
  ppStack_20 = pSrc;
  for (i2 = 0; i2 < uiCHeight; i2 = i2 + 1) {
    for (i4 = 0; i4 < uiCWidth; i4 = i4 + 1) {
      iVar1 = i4 * 4;
      if (i4 == 0) {
        j._0_1_ = (pel)((int)((uint)ppStack_20[iVar1] + (uint)ppStack_20[iVar1 + uiSrcStride] + 1)
                       >> 1);
        i._0_1_ = (pel)((int)((uint)ppStack_20[iVar1 + 1] +
                              (uint)ppStack_20[iVar1 + 1 + uiSrcStride] + 1) >> 1);
      }
      else {
        j._0_1_ = (pel)((int)((uint)ppStack_20[iVar1] * 2 + (uint)ppStack_20[iVar1 + 2] +
                              (uint)ppStack_20[iVar1 + -2] +
                              (uint)ppStack_20[iVar1 + uiSrcStride] * 2 +
                              (uint)ppStack_20[iVar1 + uiSrcStride + 2] +
                              (uint)ppStack_20[iVar1 + uiSrcStride + -2] + 4) >> 3);
        i._0_1_ = (pel)((int)((uint)ppStack_20[iVar1 + 1] * 2 + (uint)ppStack_20[iVar1 + 3] +
                              (uint)ppStack_20[iVar1 + -1] +
                              (uint)ppStack_20[iVar1 + 1 + uiSrcStride] * 2 +
                              (uint)ppStack_20[iVar1 + uiSrcStride + 3] +
                              (uint)ppStack_20[iVar1 + uiSrcStride + -1] + 4) >> 3);
      }
      _val_v[i4 * 2] = (pel)j;
      _val_v[i4 * 2 + 1] = (pel)i;
    }
    _val_v = _val_v + uiDstStride;
    ppStack_20 = ppStack_20 + (uiSrcStride << 1);
  }
  return;
}

Assistant:

void down_sample_uv(int uiCWidth, int uiCHeight, int bitDept, pel *pSrc, int uiSrcStride, pel *pDst, int uiDstStride)
{
    int val_u, val_v;

    for (int j = 0; j < uiCHeight; j++)
    {
        for (int i = 0; i < uiCWidth; i++)
        {
            int i2 = i << 1;
            int i4 = i << 2;
            if (i == 0)
            {
                val_u = (pSrc[i4] + pSrc[i4 + uiSrcStride] + 1) >> 1;
                val_v = (pSrc[i4 + 1] + pSrc[i4 + 1 + uiSrcStride] + 1) >> 1;
            }
            else
            {
                val_u = (pSrc[i4] * 2 + pSrc[i4 + 2] + pSrc[i4 - 2] + pSrc[i4 + uiSrcStride] * 2
                         + pSrc[i4 + uiSrcStride + 2] + pSrc[i4 + uiSrcStride - 2] + 4) >> 3;
                val_v = (pSrc[i4 + 1] * 2 + pSrc[i4 + 3] + pSrc[i4 - 1] + pSrc[i4 + 1 + uiSrcStride] * 2
                    + pSrc[i4 + uiSrcStride + 3] + pSrc[i4 + uiSrcStride - 1] + 4) >> 3;
            }

            pDst[i2    ] = val_u;
            pDst[i2 + 1] = val_v;
        }
        pDst += uiDstStride;
        pSrc += uiSrcStride * 2;
    }
}